

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

void __thiscall ON_NurbsSurface::EmergencyDestroy(ON_NurbsSurface *this)

{
  this->m_cv = (double *)0x0;
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order[0] = 0;
  this->m_order[1] = 0;
  this->m_cv_count[0] = 0;
  this->m_cv_count[1] = 0;
  this->m_knot_capacity[0] = 0;
  this->m_knot_capacity[1] = 0;
  this->m_knot[0] = (double *)0x0;
  this->m_knot[1] = (double *)0x0;
  *(undefined8 *)((long)this->m_knot + 0xc) = 0;
  *(undefined8 *)(this->m_cv_stride + 1) = 0;
  return;
}

Assistant:

void ON_NurbsSurface::Initialize()
{
  m_dim = 0;
  m_is_rat = 0;
  m_order[0] = 0;
  m_order[1] = 0;
  m_cv_count[0] = 0;
  m_cv_count[1] = 0;
  m_knot_capacity[0] = 0;
  m_knot_capacity[1] = 0;
  m_knot[0] = 0;
  m_knot[1] = 0;
  m_cv_stride[0] = 0;
  m_cv_stride[1] = 0;
  m_cv_capacity = 0;
  m_cv = 0;
}